

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.h
# Opt level: O1

Float __thiscall pbrt::LanczosSincFilter::Evaluate(LanczosSincFilter *this,Point2f *p)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined1 extraout_var [12];
  undefined1 extraout_var_00 [12];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  fVar1 = (p->super_Tuple2<pbrt::Point2,_float>).x;
  auVar3._8_4_ = 0x7fffffff;
  auVar3._0_8_ = 0x7fffffff7fffffff;
  auVar3._12_4_ = 0x7fffffff;
  auVar3 = vandps_avx512vl(ZEXT416((uint)fVar1),auVar3);
  fVar5 = 0.0;
  if (auVar3._0_4_ <= (this->radius).super_Tuple2<pbrt::Vector2,_float>.x) {
    fVar7 = this->tau;
    fVar5 = fVar1 * 3.1415927;
    auVar9 = SUB6416(ZEXT464(0x3f800000),0);
    auVar3 = vfmadd213ss_fma(ZEXT416((uint)fVar5),ZEXT416((uint)fVar5),auVar9);
    if ((auVar3._0_4_ != 1.0) || (NAN(auVar3._0_4_))) {
      fVar4 = sinf(fVar5);
      auVar9._0_4_ = fVar4 / fVar5;
      auVar9._4_12_ = extraout_var;
    }
    fVar5 = 1.0;
    fVar1 = (fVar1 / fVar7) * 3.1415927;
    auVar3 = vfmadd213ss_fma(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),
                             SUB6416(ZEXT464(0x3f800000),0));
    if ((auVar3._0_4_ != 1.0) || (NAN(auVar3._0_4_))) {
      fVar5 = sinf(fVar1);
      fVar5 = fVar5 / fVar1;
    }
    fVar5 = auVar9._0_4_ * fVar5;
  }
  fVar7 = 0.0;
  fVar1 = (p->super_Tuple2<pbrt::Point2,_float>).y;
  auVar2._8_4_ = 0x7fffffff;
  auVar2._0_8_ = 0x7fffffff7fffffff;
  auVar2._12_4_ = 0x7fffffff;
  auVar3 = vandps_avx512vl(ZEXT416((uint)fVar1),auVar2);
  if (auVar3._0_4_ <= (this->radius).super_Tuple2<pbrt::Vector2,_float>.y) {
    fVar4 = this->tau;
    fVar7 = fVar1 * 3.1415927;
    auVar8 = SUB6416(ZEXT464(0x3f800000),0);
    auVar3 = vfmadd213ss_fma(ZEXT416((uint)fVar7),ZEXT416((uint)fVar7),auVar8);
    if ((auVar3._0_4_ != 1.0) || (NAN(auVar3._0_4_))) {
      fVar6 = sinf(fVar7);
      auVar8._0_4_ = fVar6 / fVar7;
      auVar8._4_12_ = extraout_var_00;
    }
    fVar7 = 1.0;
    fVar1 = (fVar1 / fVar4) * 3.1415927;
    auVar3 = vfmadd213ss_fma(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),
                             SUB6416(ZEXT464(0x3f800000),0));
    if ((auVar3._0_4_ != 1.0) || (NAN(auVar3._0_4_))) {
      fVar7 = sinf(fVar1);
      fVar7 = fVar7 / fVar1;
    }
    fVar7 = auVar8._0_4_ * fVar7;
  }
  return fVar5 * fVar7;
}

Assistant:

PBRT_CPU_GPU
    Float Evaluate(const Point2f &p) const {
        return WindowedSinc(p.x, radius.x, tau) * WindowedSinc(p.y, radius.y, tau);
    }